

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_seek_to_min_key_with_deletes_test(void)

{
  fdb_status fVar1;
  fdb_status err_code;
  fdb_status err_code_00;
  char *pcVar2;
  fdb_config *in_stack_00000018;
  char *in_stack_00000020;
  fdb_file_handle **in_stack_00000028;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_status status;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffdf8;
  undefined2 uVar3;
  undefined2 in_stack_fffffffffffffdfa;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffdfc;
  fdb_file_handle *in_stack_fffffffffffffe00;
  FILE *pFVar5;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  void *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  void *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  fdb_iterator *in_stack_fffffffffffffe78;
  fdb_iterator *local_70 [2];
  fdb_kvs_handle *local_60;
  fdb_status local_58;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_70[0] = (fdb_iterator *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_54 = system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x108b);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x108b,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  err_code = fdb_kvs_open_default
                       (in_stack_fffffffffffffe00,
                        (fdb_kvs_handle **)
                        CONCAT44(in_stack_fffffffffffffdfc,
                                 CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)),
                        (fdb_kvs_config *)0x121e26);
  pFVar5 = _stderr;
  if (err_code != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(err_code);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)err_code,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x108c);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x108c,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe30,CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
             ,in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe30,CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
             ,in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  err_code_00 = fdb_del_kv((fdb_kvs_handle *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           in_stack_fffffffffffffe20,
                           CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_58 = err_code_00;
  if (err_code_00 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    pcVar2 = fdb_error_msg(err_code_00);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)err_code_00,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1092);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1092,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  uVar3 = 0;
  uVar4 = 0;
  local_58 = fdb_iterator_init(local_60,local_70,"A",1,"B",1,0);
  if (local_58 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1095);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    if (local_58 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x1095,"void iterator_seek_to_min_key_with_deletes_test()");
    }
  }
  local_58 = fdb_iterator_get(in_stack_fffffffffffffe78,(fdb_doc **)CONCAT44(fVar1,err_code));
  if (local_58 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1097);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    if (local_58 != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x1097,"void iterator_seek_to_min_key_with_deletes_test()");
    }
  }
  local_58 = fdb_iterator_seek_to_min
                       ((fdb_iterator *)CONCAT44(in_stack_fffffffffffffdfc,CONCAT22(uVar4,uVar3)));
  if (local_58 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x109a);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    if (local_58 != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x109a,"void iterator_seek_to_min_key_with_deletes_test()");
    }
  }
  fVar1 = fdb_iterator_close((fdb_iterator *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_58 = fVar1;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffdfc,CONCAT22(uVar4,uVar3)));
    pFVar5 = _stderr;
    local_58 = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x109f);
      iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x109f,"void iterator_seek_to_min_key_with_deletes_test()");
    }
    fVar1 = fdb_shutdown();
    local_58 = fVar1;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      memleak_end();
      if (iterator_seek_to_min_key_with_deletes_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","iterator seek to min test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","iterator seek to min test");
      }
      return;
    }
    pFVar5 = _stderr;
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x10a1);
    iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x10a1,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  pFVar5 = _stderr;
  pcVar2 = fdb_error_msg(fVar1);
  fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x109d);
  iterator_seek_to_min_key_with_deletes_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x109d,"void iterator_seek_to_min_key_with_deletes_test()");
}

Assistant:

void iterator_seek_to_min_key_with_deletes_test() {
    TEST_INIT();
    memleak_start();

    int r;

    fdb_status status;
    fdb_kvs_handle *db;
    fdb_file_handle *dbfile;
    fdb_iterator *it = nullptr;
    fdb_doc *rdoc = nullptr;


    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;
    TEST_STATUS(fdb_open(&dbfile, "./iterator_test1", &fconfig));
    TEST_STATUS(fdb_kvs_open_default(dbfile, &db, &kvs_config));

    fdb_set_kv(db, "B", 1, NULL, 0);
    fdb_set_kv(db, "C", 1, NULL, 0);

    status = fdb_del_kv(db, "B", 1);
    TEST_STATUS(status);

    status = fdb_iterator_init(db, &it, "A", 1, "B", 1, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    status = fdb_iterator_seek_to_min(it);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    status = fdb_iterator_close(it);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();

    TEST_RESULT("iterator seek to min test");
}